

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x64SUB(uchar *stream,x86Reg dst,x86Reg src)

{
  uchar *start;
  
  *stream = 8 < (int)dst | (8 < (int)src) << 2 | 0x48;
  stream[1] = ')';
  if ((byte)regCode[src] < 8) {
    stream[2] = regCode[src] << 3 | regCode[dst] | 0xc0;
    return 3;
  }
  __assert_fail("unsigned(spareField) <= 0x7",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x15,"unsigned char encodeRegister(x86Reg, char)");
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}